

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

JavascriptString * __thiscall
Js::ParseableFunctionInfo::GetCachedSourceString(ParseableFunctionInfo *this)

{
  RecyclerWeakReference<Js::JavascriptString> *pRVar1;
  JavascriptString *pJVar2;
  
  pRVar1 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)1,Memory::RecyclerWeakReference<Js::JavascriptString>*>
                     (&this->super_FunctionProxy);
  if (pRVar1 == (RecyclerWeakReference<Js::JavascriptString> *)0x0) {
    pJVar2 = (JavascriptString *)0x0;
  }
  else {
    pJVar2 = (JavascriptString *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef;
    if (pJVar2 == (JavascriptString *)0x0) {
      pJVar2 = (JavascriptString *)0x0;
      FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)1,decltype(nullptr)>
                (&this->super_FunctionProxy,(void *)0x0);
    }
  }
  return pJVar2;
}

Assistant:

JavascriptString * ParseableFunctionInfo::GetCachedSourceString()
    {
        RecyclerWeakReference<JavascriptString> * weakRef = GetCachedSourceStringWeakRef();
        if (weakRef)
        {
            JavascriptString * string = weakRef->Get();
            if (string)
            {
                return string;
            }
            this->SetAuxPtr<AuxPointerType::CachedSourceString>(nullptr);
        }
        return nullptr;
    }